

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

size_t __thiscall MutableS2ShapeIndex::SpaceUsed(MutableS2ShapeIndex *this)

{
  CellMap *this_00;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar4;
  uint uVar5;
  atomic<const_S2ShapeIndexCell_*> this_01;
  size_type sVar6;
  const_reference pvVar7;
  uint uVar8;
  long lVar9;
  size_type_conflict n;
  size_t sVar10;
  const_iterator cVar11;
  Iterator local_70;
  
  puVar2 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00 = &this->cell_map_;
  puVar3 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::bytes_used((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                        *)this_00);
  sVar10 = (long)puVar2 +
           (this->cell_map_).
           super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .tree_.size_ * 0x10 + (sVar6 - (long)puVar3) + 0x40;
  local_70.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_70.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002bb190;
  local_70.index_ = this;
  cVar11 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)this_00);
  local_70.end_.node = cVar11.node;
  local_70.end_.position = cVar11.position;
  local_70.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)this_00);
  local_70.iter_.position = 0;
  if (cVar11.position != 0 || local_70.iter_.node != cVar11.node) {
    if (((ulong)local_70.iter_.node & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    local_70.super_IteratorBase.id_.id_ = *(uint64 *)(local_70.iter_.node + 0x10);
    local_70.super_IteratorBase.cell_._M_b._M_p = *(__base_type *)(local_70.iter_.node + 0x18);
    if (local_70.super_IteratorBase.id_.id_ != 0xffffffffffffffff) {
      do {
        this_01._M_b._M_p = local_70.super_IteratorBase.cell_._M_b._M_p;
        uVar1 = *(uint *)local_70.super_IteratorBase.cell_._M_b._M_p;
        uVar8 = uVar1 >> 0x18 & 0x3f;
        uVar5 = 1 << ((byte)uVar8 & 0x1f);
        if ((uVar1 >> 0x1e & 1) == 0) {
          uVar5 = uVar8;
        }
        sVar10 = (ulong)uVar5 * 0x10 + sVar10;
        if ((uVar1 & 0xffffff) != 0) {
          n = 0;
          do {
            pvVar7 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                     operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                 *)this_01._M_b._M_p,n);
            lVar9 = (ulong)(*(uint *)&pvVar7->field_0x4 >> 1) << 2;
            if (*(uint *)&pvVar7->field_0x4 < 6) {
              lVar9 = 0;
            }
            sVar10 = sVar10 + lVar9;
            n = n + 1;
          } while (n < (*(uint *)this_01._M_b._M_p & 0xffffff));
        }
        Iterator::Next(&local_70);
      } while (local_70.super_IteratorBase.id_.id_ != 0xffffffffffffffff);
    }
  }
  pvVar4 = (this->pending_removals_)._M_t.
           super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           .
           super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
           ._M_head_impl;
  if (pvVar4 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                 *)0x0) {
    sVar10 = (long)*(pointer *)
                    ((long)&(pvVar4->
                            super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                            )._M_impl + 0x10) +
             (sVar10 - *(long *)&(pvVar4->
                                 super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                                 )._M_impl);
  }
  return sVar10;
}

Assistant:

size_t MutableS2ShapeIndex::SpaceUsed() const {
  size_t size = sizeof(*this);
  size += shapes_.capacity() * sizeof(std::unique_ptr<S2Shape>);
  // cell_map_ itself is already included in sizeof(*this).
  size += cell_map_.bytes_used() - sizeof(cell_map_);
  size += cell_map_.size() * sizeof(S2ShapeIndexCell);
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    const S2ShapeIndexCell& cell = it.cell();
    size += cell.shapes_.capacity() * sizeof(S2ClippedShape);
    for (int s = 0; s < cell.num_clipped(); ++s) {
      const S2ClippedShape& clipped = cell.clipped(s);
      if (!clipped.is_inline()) {
        size += clipped.num_edges() * sizeof(int32);
      }
    }
  }
  if (pending_removals_ != nullptr) {
    size += pending_removals_->capacity() * sizeof(RemovedShape);
  }

  return size;
}